

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

int __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
computeKeyRoots(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                *this,TreeIndexAPTED *t2,int subtreeRootNode,int pathID,
               vector<int,_std::allocator<int>_> *keyRoots,int index)

{
  int iVar1;
  int subtreeRootNode_00;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  const_reference this_00;
  reference piVar5;
  const_iterator cStack_50;
  int child;
  const_iterator __end0;
  const_iterator __begin0;
  value_type *__range3;
  int local_30;
  int parent;
  int pathNode;
  int index_local;
  vector<int,_std::allocator<int>_> *keyRoots_local;
  int pathID_local;
  int subtreeRootNode_local;
  TreeIndexAPTED *t2_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](keyRoots,(long)index);
  *pvVar3 = subtreeRootNode;
  parent = index + 1;
  iVar1 = pathID;
  while (local_30 = iVar1, subtreeRootNode < local_30) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PreLToParent).prel_to_parent_,(long)local_30);
    iVar1 = *pvVar4;
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&(t2->super_PreLToChildren).prel_to_children_,(long)iVar1);
    __end0 = std::vector<int,_std::allocator<int>_>::begin(this_00);
    cStack_50 = std::vector<int,_std::allocator<int>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb0), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      subtreeRootNode_00 = *piVar5;
      if (subtreeRootNode_00 != local_30) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PreLToLLD).prel_to_lld_,(long)subtreeRootNode_00);
        parent = computeKeyRoots(this,t2,subtreeRootNode_00,*pvVar4,keyRoots,parent);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
  }
  return parent;
}

Assistant:

int APTEDTreeIndex<CostModel, TreeIndex>::computeKeyRoots(const TreeIndex& t2,
    int subtreeRootNode, int pathID, std::vector<int>& keyRoots, int index) {
  // The subtreeRootNode is a keyroot node. Add it to keyRoots.
  keyRoots[index] = subtreeRootNode;
  // Increment the index to know where to store the next keyroot node.
  ++index;
  // Walk up the left path starting with the leftmost leaf of subtreeRootNode,
  // until the child of subtreeRootNode.
  int pathNode = pathID;
  while (pathNode > subtreeRootNode) {
    int parent = t2.prel_to_parent_[pathNode];
    // For each sibling to the right of pathNode, execute this method recursively.
    // Each right sibling of pathNode is a keyroot node.
    for (int child : t2.prel_to_children_[parent]) {
      // Execute computeKeyRoots recursively for the new subtree rooted at child and child's leftmost leaf node.
      if (child != pathNode) index = computeKeyRoots(t2, child, t2.prel_to_lld_[child], keyRoots, index);
    }
    // Walk up.
    pathNode = parent;
  }
  return index;
}